

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O3

void avro::parsing::add_tests(test_suite *ts)

{
  char *pcVar1;
  undefined1 local_f0 [32];
  param_test_case_generator<avro::parsing::TestData2,_const_avro::parsing::TestData2_*> local_d0;
  const_string local_58;
  const_string local_48;
  vtable_base *local_38;
  
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testCodec<avro::parsing::BinaryCodecFactory>;
  local_f0._0_8_ =
       boost::function1<void,avro::parsing::TestData>::
       assign_to<void(*)(avro::parsing::TestData_const&)>(void(*)(avro::parsing::TestData_const&))::
       stored_vtable + 1;
  local_48.m_begin = "testWithData(&testCodec<BinaryCodecFactory>, data)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_d0,(function<void_(avro::parsing::TestData)> *)local_f0,&local_48,&local_58,
             0x590,(TestData *)data,(TestData *)data2);
  boost::function1<void,_avro::parsing::TestData>::~function1
            ((function1<void,_avro::parsing::TestData> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6c00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData>::~function1
            ((function1<void,_avro::parsing::TestData> *)&local_d0.m_test_func);
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testCodec<avro::parsing::ValidatingCodecFactory>;
  local_f0._0_8_ =
       boost::function1<void,avro::parsing::TestData>::
       assign_to<void(*)(avro::parsing::TestData_const&)>(void(*)(avro::parsing::TestData_const&))::
       stored_vtable + 1;
  local_48.m_begin = "testWithData(&testCodec<ValidatingCodecFactory>, data)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_d0,(function<void_(avro::parsing::TestData)> *)local_f0,&local_48,&local_58,
             0x591,(TestData *)data,(TestData *)data2);
  boost::function1<void,_avro::parsing::TestData>::~function1
            ((function1<void,_avro::parsing::TestData> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6c00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData>::~function1
            ((function1<void,_avro::parsing::TestData> *)&local_d0.m_test_func);
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testCodec<avro::parsing::JsonCodec>;
  local_f0._0_8_ =
       boost::function1<void,avro::parsing::TestData>::
       assign_to<void(*)(avro::parsing::TestData_const&)>(void(*)(avro::parsing::TestData_const&))::
       stored_vtable + 1;
  local_48.m_begin = "testWithData(&testCodec<JsonCodec>, data)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_d0,(function<void_(avro::parsing::TestData)> *)local_f0,&local_48,&local_58,
             0x592,(TestData *)data,(TestData *)data2);
  boost::function1<void,_avro::parsing::TestData>::~function1
            ((function1<void,_avro::parsing::TestData> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6c00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData>::~function1
            ((function1<void,_avro::parsing::TestData> *)&local_d0.m_test_func);
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testCodec<avro::parsing::BinaryEncoderResolvingDecoderFactory>;
  local_f0._0_8_ =
       boost::function1<void,avro::parsing::TestData>::
       assign_to<void(*)(avro::parsing::TestData_const&)>(void(*)(avro::parsing::TestData_const&))::
       stored_vtable + 1;
  local_48.m_begin = "testWithData(&testCodec<BinaryEncoderResolvingDecoderFactory>, data)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_d0,(function<void_(avro::parsing::TestData)> *)local_f0,&local_48,&local_58,
             0x593,(TestData *)data,(TestData *)data2);
  boost::function1<void,_avro::parsing::TestData>::~function1
            ((function1<void,_avro::parsing::TestData> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6c00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData>::~function1
            ((function1<void,_avro::parsing::TestData> *)&local_d0.m_test_func);
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testReaderFail<avro::parsing::ValidatingCodecFactory>;
  local_f0._0_8_ =
       boost::function1<void,avro::parsing::TestData2>::
       assign_to<void(*)(avro::parsing::TestData2_const&)>(void(*)(avro::parsing::TestData2_const&))
       ::stored_vtable + 1;
  local_48.m_begin = "testWithData(&testReaderFail<ValidatingCodecFactory>, data2)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData2,_const_avro::parsing::TestData2_*>::
  param_test_case_generator
            (&local_d0,(function<void_(avro::parsing::TestData2)> *)local_f0,&local_48,&local_58,
             0x594,(TestData2 *)data2,(TestData2 *)data3);
  local_38 = (vtable_base *)
             (boost::function1<void,avro::parsing::TestData>::
              assign_to<void(*)(avro::parsing::TestData_const&)>(void(*)(avro::parsing::TestData_const&))
              ::stored_vtable + 1);
  boost::function1<void,_avro::parsing::TestData2>::~function1
            ((function1<void,_avro::parsing::TestData2> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6c70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData2>::~function1
            (&local_d0.m_test_func.super_function1<void,_avro::parsing::TestData2>);
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testWriterFail<avro::parsing::ValidatingCodecFactory>;
  local_f0._0_8_ =
       boost::function1<void,avro::parsing::TestData2>::
       assign_to<void(*)(avro::parsing::TestData2_const&)>(void(*)(avro::parsing::TestData2_const&))
       ::stored_vtable + 1;
  local_48.m_begin = "testWithData(&testWriterFail<ValidatingCodecFactory>, data2)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData2,_const_avro::parsing::TestData2_*>::
  param_test_case_generator
            (&local_d0,(function<void_(avro::parsing::TestData2)> *)local_f0,&local_48,&local_58,
             0x595,(TestData2 *)data2,(TestData2 *)data3);
  boost::function1<void,_avro::parsing::TestData2>::~function1
            ((function1<void,_avro::parsing::TestData2> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6c70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData2>::~function1
            (&local_d0.m_test_func.super_function1<void,_avro::parsing::TestData2>);
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testCodecResolving<avro::parsing::BinaryEncoderResolvingDecoderFactory>;
  local_f0._0_8_ =
       boost::function1<void,avro::parsing::TestData3>::
       assign_to<void(*)(avro::parsing::TestData3_const&)>(void(*)(avro::parsing::TestData3_const&))
       ::stored_vtable + 1;
  local_48.m_begin =
       "testWithData(&testCodecResolving<BinaryEncoderResolvingDecoderFactory>, data3)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>
              *)&local_d0,(function<void_(avro::parsing::TestData3)> *)local_f0,&local_48,&local_58,
             0x597,(TestData3 *)data3,(TestData3 *)jsonData);
  boost::function1<void,_avro::parsing::TestData3>::~function1
            ((function1<void,_avro::parsing::TestData3> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6cd0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData3>::~function1
            ((function1<void,_avro::parsing::TestData3> *)&local_d0.m_test_func);
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testCodecResolving2<avro::parsing::BinaryEncoderResolvingDecoderFactory>;
  local_f0._0_8_ =
       boost::function1<void,avro::parsing::TestData4>::
       assign_to<void(*)(avro::parsing::TestData4_const&)>(void(*)(avro::parsing::TestData4_const&))
       ::stored_vtable + 1;
  local_48.m_begin =
       "testWithData(&testCodecResolving2<BinaryEncoderResolvingDecoderFactory>, data4)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)&local_d0,(function<void_(avro::parsing::TestData4)> *)local_f0,&local_48,&local_58,
             0x599,(TestData4 *)data4,(TestData4 *)&DAT_001d4ee0);
  boost::function1<void,_avro::parsing::TestData4>::~function1
            ((function1<void,_avro::parsing::TestData4> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6d30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData4>::~function1
            ((function1<void,_avro::parsing::TestData4> *)&local_d0.m_test_func);
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testCodecResolving2<avro::parsing::ValidatingEncoderResolvingDecoderFactory>;
  local_f0._0_8_ =
       boost::function1<void,avro::parsing::TestData4>::
       assign_to<void(*)(avro::parsing::TestData4_const&)>(void(*)(avro::parsing::TestData4_const&))
       ::stored_vtable + 1;
  local_48.m_begin =
       "testWithData(&testCodecResolving2<ValidatingEncoderResolvingDecoderFactory>, data4)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)&local_d0,(function<void_(avro::parsing::TestData4)> *)local_f0,&local_48,&local_58,
             0x59b,(TestData4 *)data4,(TestData4 *)&DAT_001d4ee0);
  boost::function1<void,_avro::parsing::TestData4>::~function1
            ((function1<void,_avro::parsing::TestData4> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6d30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData4>::~function1
            ((function1<void,_avro::parsing::TestData4> *)&local_d0.m_test_func);
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testGeneric<avro::parsing::ValidatingCodecFactory>;
  local_f0._0_8_ = local_38;
  local_48.m_begin = "testWithData(&testGeneric<ValidatingCodecFactory>, data)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData,_const_avro::parsing::TestData_*> *)
             &local_d0,(function<void_(avro::parsing::TestData)> *)local_f0,&local_48,&local_58,
             0x59d,(TestData *)data,(TestData *)data2);
  boost::function1<void,_avro::parsing::TestData>::~function1
            ((function1<void,_avro::parsing::TestData> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6c00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData>::~function1
            ((function1<void,_avro::parsing::TestData> *)&local_d0.m_test_func);
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testGenericResolving<avro::parsing::ValidatingCodecFactory>;
  local_f0._0_8_ =
       boost::function1<void,avro::parsing::TestData3>::
       assign_to<void(*)(avro::parsing::TestData3_const&)>(void(*)(avro::parsing::TestData3_const&))
       ::stored_vtable + 1;
  local_48.m_begin = "testWithData(&testGenericResolving<ValidatingCodecFactory>, data3)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData3,_const_avro::parsing::TestData3_*>
              *)&local_d0,(function<void_(avro::parsing::TestData3)> *)local_f0,&local_48,&local_58,
             0x59e,(TestData3 *)data3,(TestData3 *)jsonData);
  boost::function1<void,_avro::parsing::TestData3>::~function1
            ((function1<void,_avro::parsing::TestData3> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6cd0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData3>::~function1
            ((function1<void,_avro::parsing::TestData3> *)&local_d0.m_test_func);
  local_58.m_end = "";
  do {
    pcVar1 = local_58.m_end + 1;
    local_58.m_end = local_58.m_end + 1;
  } while (*pcVar1 != '\0');
  local_f0._8_8_ = testGenericResolving2<avro::parsing::ValidatingCodecFactory>;
  local_f0._0_8_ =
       boost::function1<void,avro::parsing::TestData4>::
       assign_to<void(*)(avro::parsing::TestData4_const&)>(void(*)(avro::parsing::TestData4_const&))
       ::stored_vtable + 1;
  local_48.m_begin = "testWithData(&testGenericResolving2<ValidatingCodecFactory>, data4)";
  local_48.m_end = "";
  local_58.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::parsing::TestData4,_const_avro::parsing::TestData4_*>
              *)&local_d0,(function<void_(avro::parsing::TestData4)> *)local_f0,&local_48,&local_58,
             0x59f,(TestData4 *)data4,(TestData4 *)&DAT_001d4ee0);
  boost::function1<void,_avro::parsing::TestData4>::~function1
            ((function1<void,_avro::parsing::TestData4> *)local_f0);
  boost::unit_test::test_suite::add(ts,&local_d0.super_test_unit_generator,0);
  local_d0.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001d6d30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_tc_name._M_dataplus._M_p != &local_d0.m_tc_name.field_2) {
    operator_delete(local_d0.m_tc_name._M_dataplus._M_p,
                    local_d0.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::parsing::TestData4>::~function1
            ((function1<void,_avro::parsing::TestData4> *)&local_d0.m_test_func);
  return;
}

Assistant:

void add_tests(boost::unit_test::test_suite& ts)
{
    ADD_TESTS(ts, BinaryCodecFactory, testCodec, data);
    ADD_TESTS(ts, ValidatingCodecFactory, testCodec, data);
    ADD_TESTS(ts, JsonCodec, testCodec, data);
    ADD_TESTS(ts, BinaryEncoderResolvingDecoderFactory, testCodec, data);
    ADD_TESTS(ts, ValidatingCodecFactory, testReaderFail, data2);
    ADD_TESTS(ts, ValidatingCodecFactory, testWriterFail, data2);
    ADD_TESTS(ts, BinaryEncoderResolvingDecoderFactory,
        testCodecResolving, data3);
    ADD_TESTS(ts, BinaryEncoderResolvingDecoderFactory,
        testCodecResolving2, data4);
    ADD_TESTS(ts, ValidatingEncoderResolvingDecoderFactory,
        testCodecResolving2, data4);

    ADD_TESTS(ts, ValidatingCodecFactory, testGeneric, data);
    ADD_TESTS(ts, ValidatingCodecFactory, testGenericResolving, data3);
    ADD_TESTS(ts, ValidatingCodecFactory, testGenericResolving2, data4);
}